

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Sector_SetFade(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                     int arg4)

{
  uint uVar1;
  FSectorTagIterator itr;
  
  if (arg0 == 0) {
    itr.start = 0;
  }
  else {
    itr.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  itr.searchtag = arg0;
  while( true ) {
    uVar1 = FSectorTagIterator::Next(&itr);
    if ((int)uVar1 < 0) break;
    sector_t::SetFade((sector_t *)(sectors + uVar1),arg1,arg2,arg3);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetFade)
// Sector_SetFade (tag, r, g, b)
{
	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		sectors[secnum].SetFade(arg1, arg2, arg3);
	}
	return true;
}